

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

UnsupportedError *
mp::MakeUnsupportedError
          (UnsupportedError *__return_storage_ptr__,CStringRef format_str,ArgList args)

{
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  ArgList args_00;
  string local_30;
  
  args_00.types_ = args.field_1;
  args_00.field_1.args_ = in_R8.args_;
  fmt::format_abi_cxx11_(&local_30,(fmt *)format_str.data_,(char *)args.types_,args_00);
  UnsupportedError::UnsupportedError<std::__cxx11::string>
            (__return_storage_ptr__,(CStringRef)0x1ee5f6,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline UnsupportedError MakeUnsupportedError(
    fmt::CStringRef format_str, fmt::ArgList args) {
  return UnsupportedError("unsupported: {}", fmt::format(format_str, args));
}